

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.h
# Opt level: O2

void __thiscall
BenevolentBotStrategy::BenevolentBotStrategy(BenevolentBotStrategy *this,Player *player)

{
  string *this_00;
  allocator<char> local_19;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,player);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013a918;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"BENEVOLENT",&local_19);
  (this->super_PlayerStrategy).strategyName = this_00;
  return;
}

Assistant:

explicit BenevolentBotStrategy(Player* player): PlayerStrategy(player){ this->strategyName = new std::string("BENEVOLENT"); }